

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  string *psVar2;
  int __c;
  char *pcVar3;
  Iterator IVar4;
  int local_130;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  string local_e0;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  Formatter format;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (!bVar1) {
    GenerateFieldAccessorDefinitions(this,printer);
    __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar4 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
    __begin3._0_8_ = IVar4.descriptor;
    __end3.descriptor._0_4_ = IVar4.idx;
    IVar4 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
    __end3._0_8_ = IVar4.descriptor;
    oneof._0_4_ = IVar4.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof), bVar1) {
      format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
      Formatter::Formatter((Formatter *)local_88,printer,&this->variables_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"camel_oneof_name",&local_a9);
      psVar2 = OneofDescriptor::name_abi_cxx11_
                         ((OneofDescriptor *)
                          format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      UnderscoresToCamelCase(&local_e0,psVar2,true);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_88,&local_a8,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,"oneof_name",&local_101);
      psVar2 = OneofDescriptor::name_abi_cxx11_
                         ((OneofDescriptor *)
                          format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::Set<std::__cxx11::string>((Formatter *)local_88,&local_100,psVar2);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::allocator<char>::allocator();
      pcVar3 = "oneof_index";
      std::__cxx11::string::string((string *)&local_128,"oneof_index",&local_129);
      pcVar3 = OneofDescriptor::index
                         ((OneofDescriptor *)
                          format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar3,__c);
      local_130 = (int)pcVar3;
      Formatter::Set<int>((Formatter *)local_88,&local_128,&local_130);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      Formatter::operator()
                ((Formatter *)local_88,
                 "inline $classname$::$camel_oneof_name$Case $classname$::${1$$oneof_name$_case$}$() const {\n  return $classname$::$camel_oneof_name$Case(_oneof_case_[$oneof_index$]);\n}\n"
                 ,(OneofDescriptor **)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      Formatter::~Formatter((Formatter *)local_88);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(printer);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(printer, variables_);
    format.Set("camel_oneof_name", UnderscoresToCamelCase(oneof->name(), true));
    format.Set("oneof_name", oneof->name());
    format.Set("oneof_index", oneof->index());
    format(
        "inline $classname$::$camel_oneof_name$Case $classname$::"
        "${1$$oneof_name$_case$}$() const {\n"
        "  return $classname$::$camel_oneof_name$Case("
        "_oneof_case_[$oneof_index$]);\n"
        "}\n",
        oneof);
  }
}